

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subvq.c
# Opt level: O3

void subvq_subvec_eval_logs3(subvq_t *vq,float32 *feat,int32 s,logmath_t *logmath)

{
  vector_gautbl_t *pvVar1;
  float32 *x;
  int32 *piVar2;
  long lVar3;
  long lVar4;
  
  pvVar1 = vq->gautbl;
  lVar3 = (long)pvVar1[s].veclen;
  x = vq->subvec;
  if (0 < lVar3) {
    piVar2 = vq->featdim[s];
    lVar4 = 0;
    do {
      x[lVar4] = feat[piVar2[lVar4]];
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
  }
  vector_gautbl_eval_logs3(pvVar1 + s,0,vq->vqsize,x,vq->vqdist[s],logmath);
  return;
}

Assistant:

void
subvq_subvec_eval_logs3(subvq_t * vq, float32 * feat, int32 s, logmath_t * logmath)
{
    int32 i;
    int32 *featdim;

    /* Extract subvector from feat */
    featdim = vq->featdim[s];
    for (i = 0; i < vq->gautbl[s].veclen; i++)
        vq->subvec[i] = feat[featdim[i]];

    /* Evaluate distances between extracted subvector and corresponding codebook */
    vector_gautbl_eval_logs3(&(vq->gautbl[s]), 0, vq->vqsize, vq->subvec,
                             vq->vqdist[s], logmath);
}